

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O2

DS_STATUS ds_entry_remove(DsListEntry **entryAdd)

{
  DsListEntry *__ptr;
  DsListEntry *pDVar1;
  
  if (entryAdd == (DsListEntry **)0x0) {
    return DS_STATUS_NULL;
  }
  __ptr = *entryAdd;
  if (__ptr == (DsListEntry *)0x0) {
    return DS_STATUS_NULL;
  }
  pDVar1 = __ptr->prev;
  if (__ptr->next == (DsListEntry *)0x0) {
    if (pDVar1 == (DsListEntry *)0x0) {
      *entryAdd = (DsListEntry *)0x0;
      goto LAB_00101410;
    }
LAB_001013f0:
    entryAdd = &pDVar1->next;
  }
  else if (pDVar1 != (DsListEntry *)0x0) goto LAB_001013f0;
  *entryAdd = __ptr->next;
  if (__ptr->next != (DsListEntry *)0x0) {
    __ptr->next->prev = __ptr->prev;
  }
LAB_00101410:
  free(__ptr);
  return DS_STATUS_OK;
}

Assistant:

static DS_STATUS ds_entry_remove(DsListEntry **entryAdd)
{
    if (NULL == entryAdd || NULL == *entryAdd)
        return DS_STATUS_NULL;
    DsListEntry *entry = *entryAdd;
    if (NULL == entry->next && NULL == entry->prev)
        *entryAdd = NULL;
    else
    {
        if (entry->prev)
            entry->prev->next = entry->next;
        else
            *entryAdd = entry->next;

        if (entry->next)
            entry->next->prev = entry->prev;
    }
    free(entry);
    return DS_STATUS_OK;
}